

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int evp_keyex_on_exchange
              (ptls_key_exchange_context_t **_ctx,int release,ptls_iovec_t *secret,
              ptls_iovec_t peerkey)

{
  long lVar1;
  int iVar2;
  void *pvVar3;
  undefined8 in_RCX;
  undefined8 *in_RDX;
  int in_ESI;
  long *in_RDI;
  long in_R8;
  int ret;
  EVP_PKEY_CTX *evpctx;
  EVP_PKEY *evppeer;
  st_evp_keyex_context_t *ctx;
  int local_44;
  EVP_PKEY_CTX *local_40;
  EVP_PKEY *local_38;
  
  lVar1 = *in_RDI;
  local_38 = (EVP_PKEY *)0x0;
  local_40 = (EVP_PKEY_CTX *)0x0;
  if (in_RDX == (undefined8 *)0x0) {
    local_44 = 0;
  }
  else {
    *in_RDX = 0;
    if (in_R8 == *(long *)(lVar1 + 0x10)) {
      local_38 = EVP_PKEY_new();
      if (local_38 == (EVP_PKEY *)0x0) {
        local_44 = 0x201;
      }
      else {
        iVar2 = EVP_PKEY_copy_parameters(local_38,*(EVP_PKEY **)(lVar1 + 0x20));
        if (iVar2 < 1) {
          local_44 = 0x203;
        }
        else {
          iVar2 = EVP_PKEY_set1_encoded_public_key(local_38,in_RCX,in_R8);
          if (iVar2 < 1) {
            local_44 = 0x203;
          }
          else {
            local_40 = EVP_PKEY_CTX_new(*(EVP_PKEY **)(lVar1 + 0x20),(ENGINE *)0x0);
            if (local_40 == (EVP_PKEY_CTX *)0x0) {
              local_44 = 0x203;
            }
            else {
              iVar2 = EVP_PKEY_derive_init(local_40);
              if (iVar2 < 1) {
                local_44 = 0x203;
              }
              else {
                iVar2 = EVP_PKEY_derive_set_peer(local_40,local_38);
                if (iVar2 < 1) {
                  local_44 = 0x203;
                }
                else {
                  iVar2 = EVP_PKEY_derive(local_40,(uchar *)0x0,in_RDX + 1);
                  if (iVar2 < 1) {
                    local_44 = 0x203;
                  }
                  else {
                    pvVar3 = malloc(in_RDX[1]);
                    *in_RDX = pvVar3;
                    if (pvVar3 == (void *)0x0) {
                      local_44 = 0x201;
                    }
                    else {
                      iVar2 = EVP_PKEY_derive(local_40,(uchar *)*in_RDX,in_RDX + 1);
                      if (iVar2 < 1) {
                        local_44 = 0x203;
                      }
                      else {
                        local_44 = 0;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    else {
      local_44 = 0x33;
    }
  }
  if (local_40 != (EVP_PKEY_CTX *)0x0) {
    EVP_PKEY_CTX_free(local_40);
  }
  if (local_38 != (EVP_PKEY *)0x0) {
    EVP_PKEY_free(local_38);
  }
  if (local_44 != 0) {
    free((void *)*in_RDX);
  }
  if (in_ESI != 0) {
    evp_keyex_free((st_evp_keyex_context_t *)0x106dfc);
    *in_RDI = 0;
  }
  return local_44;
}

Assistant:

static int evp_keyex_on_exchange(ptls_key_exchange_context_t **_ctx, int release, ptls_iovec_t *secret, ptls_iovec_t peerkey)
{
    struct st_evp_keyex_context_t *ctx = (void *)*_ctx;
    EVP_PKEY *evppeer = NULL;
    EVP_PKEY_CTX *evpctx = NULL;
    int ret;

    if (secret == NULL) {
        ret = 0;
        goto Exit;
    }

    secret->base = NULL;

    if (peerkey.len != ctx->super.pubkey.len) {
        ret = PTLS_ALERT_DECRYPT_ERROR;
        goto Exit;
    }

    if ((evppeer = EVP_PKEY_new()) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    if (EVP_PKEY_copy_parameters(evppeer, ctx->privkey) <= 0) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    if (EVP_PKEY_set1_tls_encodedpoint(evppeer, peerkey.base, peerkey.len) <= 0) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    if ((evpctx = EVP_PKEY_CTX_new(ctx->privkey, NULL)) == NULL) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    if (EVP_PKEY_derive_init(evpctx) <= 0) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    if (EVP_PKEY_derive_set_peer(evpctx, evppeer) <= 0) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    if (EVP_PKEY_derive(evpctx, NULL, &secret->len) <= 0) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    if ((secret->base = malloc(secret->len)) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    if (EVP_PKEY_derive(evpctx, secret->base, &secret->len) <= 0) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }

    ret = 0;
Exit:
    if (evpctx != NULL)
        EVP_PKEY_CTX_free(evpctx);
    if (evppeer != NULL)
        EVP_PKEY_free(evppeer);
    if (ret != 0)
        free(secret->base);
    if (release) {
        evp_keyex_free(ctx);
        *_ctx = NULL;
    }
    return ret;
}